

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void check_duplex<float>(float *input_buffer,float *output_buffer,long frame_count,
                        int input_channel_count)

{
  bool bVar1;
  stringstream *this;
  AssertHelperData *pAVar2;
  int line;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  char *message;
  float fVar6;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  AssertionResult local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40 [2];
  AssertHelper local_30;
  long local_28;
  
  local_40[0].ptr_._0_4_ = 0x100;
  local_28 = frame_count;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_50,"frame_count","256",&local_28,(int *)local_40);
  if (local_50.success_ == false) {
    this = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this);
    *(undefined8 *)(this + *(long *)(*(long *)(this + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_50.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_50.message_.ptr_)->_M_dataplus)._M_p;
    }
    local_40[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x2ad,message);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (((local_40[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_40[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_40[0].ptr_ + 8))();
    }
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_50.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.success_ = output_buffer != (float *)0x0;
    local_50.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (output_buffer == (float *)0x0) {
      pAVar2 = (AssertHelperData *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)pAVar2);
      *(undefined8 *)((long)&(pAVar2->message).c_str_ + *(long *)(*(long *)&pAVar2->line + -0x18)) =
           0x11;
      local_58.data_ = pAVar2;
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)local_40,&local_50,"!!output_buffer","false","true");
      line = 0x2af;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_50.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_50.success_ = input_buffer != (float *)0x0;
      local_50.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_50.success_) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_50.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        if (local_28 < 1) {
          return;
        }
        pfVar3 = input_buffer + 1;
        uVar4 = 0;
        do {
          if (input_channel_count == 2) {
            output_buffer[uVar4] = pfVar3[-1];
            fVar6 = *pfVar3;
            uVar5 = uVar4 | 1;
LAB_0010d1b9:
            output_buffer[uVar5] = fVar6;
          }
          else if (input_channel_count == 1) {
            fVar6 = *(float *)((long)input_buffer + uVar4 * 2);
            output_buffer[uVar4 + 1] = fVar6;
            uVar5 = uVar4;
            goto LAB_0010d1b9;
          }
          uVar4 = uVar4 + 2;
          pfVar3 = pfVar3 + input_channel_count;
          local_28 = local_28 + -1;
          if (local_28 == 0) {
            return;
          }
        } while( true );
      }
      pAVar2 = (AssertHelperData *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)pAVar2);
      *(undefined8 *)((long)&(pAVar2->message).c_str_ + *(long *)(*(long *)&pAVar2->line + -0x18)) =
           0x11;
      local_58.data_ = pAVar2;
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)local_40,&local_50,"!!input_buffer","false","true");
      line = 0x2b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,line,(char *)local_40[0].ptr_);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_40[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(local_40[0].ptr_);
    }
    if (((local_58.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_58.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

void check_duplex(const T * input_buffer,
                  T * output_buffer, long frame_count,
                  int input_channel_count)
{
  ASSERT_EQ(frame_count, 256);
  // Silence scan-build warning.
  ASSERT_TRUE(!!output_buffer); assert(output_buffer);
  ASSERT_TRUE(!!input_buffer); assert(input_buffer);

  int output_index = 0;
  int input_index = 0;
  for (int i = 0; i < frame_count; i++) {
    // output is two channels, input one or two channels.
    if (input_channel_count == 1) {
      output_buffer[output_index] = output_buffer[output_index + 1] = input_buffer[i];
    } else if (input_channel_count == 2) {
      output_buffer[output_index] = input_buffer[input_index];
      output_buffer[output_index + 1] = input_buffer[input_index + 1];
    }
    output_index += 2;
    input_index += input_channel_count;
  }
}